

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  SQInteger SVar7;
  char *pcVar8;
  SQLexer *in_RDI;
  bool bVar9;
  float fVar10;
  double dVar11;
  SQChar c;
  int i;
  bool hasDot;
  bool hasExp;
  SQFloat value;
  SQChar *sTemp;
  SQInteger firstchar;
  SQInteger type;
  SQUnsignedInteger *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  size_type local_3c;
  char *local_28;
  ulong local_20;
  undefined8 local_18;
  SQInteger local_8;
  
  local_18 = 1;
  local_20 = (ulong)in_RDI->_currdata;
  sqvector<char,_unsigned_int>::resize
            ((sqvector<char,_unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (size_type)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  do {
    Next(in_RDI);
    in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
  } while (in_RDI->_currdata == '_');
  if ((local_20 == 0x30) && (iVar4 = isdigit((uint)in_RDI->_currdata), iVar4 != 0)) {
    SQCompilation::SQCompilationContext::reportDiagnostic
              (in_RDI->_ctx,DI_OCTAL_NOT_SUPPORTED,(int32_t)(in_RDI->_tokenline & 0xffffffff),
               (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
               (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
  }
  if ((local_20 == 0x30) && (iVar4 = toupper((uint)in_RDI->_currdata), iVar4 == 0x58)) {
    do {
      Next(in_RDI);
      in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
    } while (in_RDI->_currdata == '_');
    local_18 = 3;
    while (iVar4 = isxdigit((uint)in_RDI->_currdata), iVar4 != 0) {
      sqvector<char,_unsigned_int>::push_back
                ((sqvector<char,_unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (char *)in_stack_ffffffffffffff98);
      do {
        Next(in_RDI);
        in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
      } while (in_RDI->_currdata == '_');
    }
    sVar5 = sqvector<char,_unsigned_int>::size(&in_RDI->_longstr);
    if (0x10 < sVar5) {
      SQCompilation::SQCompilationContext::reportDiagnostic
                (in_RDI->_ctx,DI_HEX_TOO_MANY_DIGITS,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                 (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                 (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
    }
    sVar5 = sqvector<char,_unsigned_int>::size(&in_RDI->_longstr);
    if (sVar5 == 0) {
      SQCompilation::SQCompilationContext::reportDiagnostic
                (in_RDI->_ctx,DI_HEX_DIGITS_EXPECTED,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                 (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                 (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
    }
  }
  else {
    sqvector<char,_unsigned_int>::push_back
              ((sqvector<char,_unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)in_stack_ffffffffffffff98);
    bVar2 = false;
    bVar3 = false;
    while( true ) {
      bVar9 = true;
      if (in_RDI->_currdata != '.') {
        iVar4 = isalnum((uint)in_RDI->_currdata);
        bVar9 = iVar4 != 0;
      }
      if (!bVar9) break;
      if (in_RDI->_currdata == '.') {
        if ((bVar3) || (bVar2)) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_MALFORMED_NUMBER,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                    );
        }
        bVar3 = true;
        local_18 = 2;
      }
      else {
        SVar7 = isexponent((ulong)in_RDI->_currdata);
        if (SVar7 != 0) {
          if (bVar2) {
            SQCompilation::SQCompilationContext::reportDiagnostic
                      (in_RDI->_ctx,DI_MALFORMED_NUMBER,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                       (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                       (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn -
                                             (int)in_RDI->_tokencolumn));
          }
          bVar2 = true;
          local_18 = 4;
          sqvector<char,_unsigned_int>::push_back
                    ((sqvector<char,_unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)in_stack_ffffffffffffff98);
          Next(in_RDI);
          in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          if ((in_RDI->_currdata == '+') || (in_RDI->_currdata == '-')) {
            sqvector<char,_unsigned_int>::push_back
                      ((sqvector<char,_unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_stack_ffffffffffffff98);
            Next(in_RDI);
            in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
          }
          iVar4 = isdigit((uint)in_RDI->_currdata);
          if (iVar4 == 0) {
            SQCompilation::SQCompilationContext::reportDiagnostic
                      (in_RDI->_ctx,DI_FP_EXP_EXPECTED,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                       (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                       (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn -
                                             (int)in_RDI->_tokencolumn));
          }
        }
      }
      iVar4 = isdigit((uint)in_RDI->_currdata);
      if (((iVar4 == 0) && (SVar7 = isexponent((ulong)in_RDI->_currdata), SVar7 == 0)) &&
         (in_RDI->_currdata != '.')) {
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (in_RDI->_ctx,DI_MALFORMED_NUMBER,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                   (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                   (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
      }
      sqvector<char,_unsigned_int>::push_back
                ((sqvector<char,_unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (char *)in_stack_ffffffffffffff98);
      do {
        Next(in_RDI);
        in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
      } while (in_RDI->_currdata == '_');
    }
  }
  sqvector<char,_unsigned_int>::push_back
            ((sqvector<char,_unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)in_stack_ffffffffffffff98);
  switch(local_18) {
  case 1:
    pcVar8 = sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,0);
    bVar3 = LexInteger(pcVar8,(SQUnsignedInteger *)&in_RDI->_nvalue);
    if (!bVar3) {
      SQCompilation::SQCompilationContext::reportDiagnostic
                (in_RDI->_ctx,DI_LITERAL_OVERFLOW,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                 (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                 (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn),
                 "integer");
    }
    local_8 = 0x104;
    break;
  case 2:
  case 4:
    pcVar8 = sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,0);
    dVar11 = strtod(pcVar8,&local_28);
    fVar10 = (float)dVar11;
    in_RDI->_fvalue = fVar10;
    if ((fVar10 == 0.0) && (!NAN(fVar10))) {
      local_3c = 0;
      while (sVar5 = local_3c, sVar6 = sqvector<char,_unsigned_int>::size(&in_RDI->_longstr),
            sVar5 < sVar6) {
        pcVar8 = sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,local_3c);
        cVar1 = *pcVar8;
        if (((cVar1 == '\0') || (cVar1 == 'e')) || (cVar1 == 'E')) break;
        if ((cVar1 != '.') && (cVar1 != '0')) {
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (in_RDI->_ctx,DI_LITERAL_UNDERFLOW,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                     (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                     (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn)
                     ,"float");
        }
        local_3c = local_3c + 1;
      }
    }
    if (3.4028235e+38 <= in_RDI->_fvalue) {
      SQCompilation::SQCompilationContext::reportDiagnostic
                (in_RDI->_ctx,DI_LITERAL_OVERFLOW,(int32_t)(in_RDI->_tokenline & 0xffffffff),
                 (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
                 (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn),
                 "float");
    }
    local_8 = 0x105;
    break;
  case 3:
    sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,0);
    LexHexadecimal((SQChar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
    local_8 = 0x104;
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4

    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    volatile SQFloat value;
    INIT_TEMP_STRING();
    NUM_NEXT();
    if(firstchar == _SC('0') && isdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_OCTAL_NOT_SUPPORTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X')) ) {
        NUM_NEXT();
        type = THEX;
        while(isxdigit(CUR_CHAR)) {
            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
        if(_longstr.size() > MAX_HEX_DIGITS)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_TOO_MANY_DIGITS, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(_longstr.size() == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_DIGITS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    }
    else {
        APPEND_CHAR((SQChar)firstchar);
        bool hasExp = false;
        bool hasDot = false;
        while (CUR_CHAR == _SC('.') || isalnum(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.')) {
                if(hasDot || hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasDot = true;
                type = TFLOAT;
            }
            else if(isexponent(CUR_CHAR)) {
                if(hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasExp = true;
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!isdigit(CUR_CHAR))
                    _ctx.reportDiagnostic(DiagnosticsId::DI_FP_EXP_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
            }
            if(!isdigit(CUR_CHAR) && !isexponent(CUR_CHAR) && CUR_CHAR != '.')
                _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);

            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
#if SQ_USE_STD_FROM_CHARS
        {
            auto ret = std::from_chars(&_longstr[0], &_longstr[0] + _longstr.size(), _fvalue);
            if (ret.ec == std::errc::result_out_of_range)
                _ctx.reportDiagnostic(_fvalue == 0 ? DiagnosticsId::DI_LITERAL_UNDERFLOW : DiagnosticsId::DI_LITERAL_OVERFLOW,
                    _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");

            for (const char * c = ret.ptr; c < &_longstr[0] + _longstr.size() - 1; ++c)
                if (*c != '0')
                {
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                }
        }
#else
        value = (SQFloat)strtod(&_longstr[0], &sTemp);
        _fvalue = value;
        if(value == 0)
        {
            for(int i = 0; i < _longstr.size(); i++)
            {
                SQChar c = _longstr[i];
                if (!c || c == 'e' || c == 'E')
                    break;
                if (c != '.' && c != '0')
                    _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_UNDERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
            }
        }
#endif

        if(sizeof(_fvalue) == sizeof(float))
        {
            if (_fvalue >= FLT_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        else if(sizeof(_fvalue) == sizeof(double))
        {
            if (_fvalue >= DBL_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        return TK_FLOAT;
    case TINT:
        if(!LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue))
            _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "integer");
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}